

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<AliasData_*,_2U>::~SmallArray(SmallArray<AliasData_*,_2U> *this)

{
  AliasData **ppAVar1;
  
  ppAVar1 = this->data;
  if (ppAVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppAVar1 != (AliasData **)0x0) {
        (*(code *)NULLC::dealloc)(ppAVar1);
      }
    }
    else if (ppAVar1 != (AliasData **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}